

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::printLearntStats(SAT *this)

{
  uint uVar1;
  uint uVar2;
  Clause **ppCVar3;
  Clause **ppCVar4;
  ostream *poVar5;
  int *piVar6;
  long in_RDI;
  bool bVar7;
  uint i;
  Clause *in_stack_00000168;
  string local_30 [32];
  uint local_10;
  
  ppCVar3 = ::vec::operator_cast_to_Clause__((vec *)(in_RDI + 0x20));
  ppCVar4 = ::vec::operator_cast_to_Clause__((vec *)(in_RDI + 0x20));
  uVar1 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 0x20));
  std::sort<Clause**,raw_activity_gt>(ppCVar3,ppCVar4 + uVar1);
  std::operator<<((ostream *)&std::cerr,"top ten clauses:\n");
  local_10 = 0;
  while( true ) {
    uVar1 = local_10;
    bVar7 = false;
    if (local_10 < 10) {
      uVar2 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 0x20));
      bVar7 = uVar1 < uVar2;
    }
    if (!bVar7) break;
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,local_10);
    poVar5 = std::operator<<(poVar5,": ");
    ppCVar3 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_10);
    piVar6 = Clause::rawActivity(*ppCVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar6);
    poVar5 = std::operator<<(poVar5," ");
    vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_10);
    showClause_abi_cxx11_(in_stack_00000168);
    poVar5 = std::operator<<(poVar5,local_30);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_30);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void SAT::printLearntStats() {
	/* std::ofstream clausefile("clause-info.csv"); */
	/* for (int i = 0 ; i < learnts.size() ; i++) { */
	/*   clausefile << learnts[i]->clauseID() << "," << learnts[i]->rawActivity() << "," <<
	 * showClause(*learnts[i]) << "\n"; */
	/* } */

	std::sort((Clause**)learnts, (Clause**)learnts + learnts.size(), raw_activity_gt());
	std::cerr << "top ten clauses:\n";
	for (unsigned int i = 0; i < 10 && i < learnts.size(); i++) {
		std::cerr << i << ": " << learnts[i]->rawActivity() << " " << showClause(*learnts[i]) << "\n";
	}
}